

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

int json_object_update_existing(json_t *object,json_t *other)

{
  void *pvVar1;
  char *key;
  size_t key_len;
  json_t *value;
  json_object_t *object_1;
  int local_48;
  
  if ((object == (json_t *)0x0) || (other == (json_t *)0x0)) {
    local_48 = -1;
  }
  else {
    local_48 = -1;
    if ((object->type == JSON_OBJECT) && (other->type == JSON_OBJECT)) {
      pvVar1 = hashtable_iter((hashtable_t *)(other + 2));
      if (pvVar1 == (void *)0x0) {
        key = (char *)0x0;
      }
      else {
        key = (char *)hashtable_iter_key(pvVar1);
      }
      local_48 = 0;
      if (key != (char *)0x0) {
        key_len = hashtable_iter_key_len(key + -0x28);
        local_48 = 0;
        while( true ) {
          value = (json_t *)hashtable_iter_value(key + -0x28);
          if (value == (json_t *)0x0) break;
          if ((object->type == JSON_OBJECT) &&
             (pvVar1 = hashtable_get((hashtable_t *)(object + 2),key,key_len), pvVar1 != (void *)0x0
             )) {
            json_object_setn_new_nocheck(object,key,key_len,value);
          }
          if (other->type == JSON_OBJECT) {
            pvVar1 = hashtable_iter_next((hashtable_t *)(other + 2),key + -0x28);
          }
          else {
            pvVar1 = (void *)0x0;
          }
          if (pvVar1 == (void *)0x0) {
            key = (char *)0x0;
          }
          else {
            key = (char *)hashtable_iter_key(pvVar1);
          }
          if (key == (char *)0x0) {
            return 0;
          }
          key_len = hashtable_iter_key_len(key + -0x28);
        }
      }
    }
  }
  return local_48;
}

Assistant:

int json_object_update_existing(json_t *object, json_t *other) {
    const char *key;
    size_t key_len;
    json_t *value;

    if (!json_is_object(object) || !json_is_object(other))
        return -1;

    json_object_keylen_foreach(other, key, key_len, value) {
        if (json_object_getn(object, key, key_len))
            json_object_setn_nocheck(object, key, key_len, value);
    }

    return 0;
}